

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O0

void __thiscall
TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_>::ComputeV2
          (TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *this,TPZFMatrix<double> *x,
          TPZFMatrix<double> *v2)

{
  bool bVar1;
  reference this_00;
  TPZFMatrix<double> *in_RDI;
  TPZFNMatrix<100,_double> v2_local;
  TPZFNMatrix<100,_double> Residual_local;
  int isub;
  const_iterator it;
  list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
  *in_stack_fffffffffffff818;
  TPZDohrAssembly<double> *in_stack_fffffffffffff820;
  TPZFNMatrix<100,_double> *in_stack_fffffffffffff830;
  _Self in_stack_fffffffffffff840;
  int in_stack_fffffffffffff84c;
  TPZDohrAssembly<double> *in_stack_fffffffffffff850;
  TPZFMatrix<double> *in_stack_fffffffffffffad0;
  TPZFMatrix<double> *in_stack_fffffffffffffad8;
  TPZDohrSubstructCondense<double> *in_stack_fffffffffffffae0;
  _Self local_38;
  _List_node_base *local_30;
  int local_24;
  _List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_> local_20 [4];
  
  std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>::
  _List_const_iterator(local_20);
  local_24 = 0;
  local_30 = (_List_node_base *)
             std::__cxx11::
             list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
             ::begin(in_stack_fffffffffffff818);
  local_20[0]._M_node = local_30;
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
         ::end(in_stack_fffffffffffff818);
    bVar1 = std::operator!=(local_20,&local_38);
    if (!bVar1) break;
    TPZFNMatrix<100,_double>::TPZFNMatrix(in_stack_fffffffffffff830);
    TPZFNMatrix<100,_double>::TPZFNMatrix(in_stack_fffffffffffff830);
    in_stack_fffffffffffff830 =
         (TPZFNMatrix<100,_double> *)
         TPZAutoPointer<TPZDohrAssembly<double>_>::operator->
                   ((TPZAutoPointer<TPZDohrAssembly<double>_> *)
                    &(in_RDI->fPivot).super_TPZVec<int>.fNAlloc);
    TPZDohrAssembly<double>::Extract
              (in_stack_fffffffffffff850,in_stack_fffffffffffff84c,
               (TPZFMatrix<double> *)in_stack_fffffffffffff840._M_node,in_RDI);
    this_00 = std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>::
              operator*((_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_> *)
                        in_stack_fffffffffffff820);
    TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(this_00);
    TPZDohrSubstructCondense<double>::Contribute_v2_local
              (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
    in_stack_fffffffffffff820 =
         TPZAutoPointer<TPZDohrAssembly<double>_>::operator->
                   ((TPZAutoPointer<TPZDohrAssembly<double>_> *)
                    &(in_RDI->fPivot).super_TPZVec<int>.fNAlloc);
    TPZDohrAssembly<double>::Assemble
              (in_stack_fffffffffffff850,in_stack_fffffffffffff84c,
               (TPZFMatrix<double> *)in_stack_fffffffffffff840._M_node,in_RDI);
    TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x1f81163);
    TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x1f81170);
    in_stack_fffffffffffff840 =
         std::_List_const_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>::operator++
                   (local_20,0);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::ComputeV2(const TPZFMatrix<TVar> &x, TPZFMatrix<TVar> &v2) const
{
	
	typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
	
	int isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		// contribute v2 deve ser uma tarefa inicializada mais cedo
		TPZFNMatrix<100,TVar> Residual_local,v2_local;
		fAssemble->Extract(isub,x,Residual_local);
		(*it)->Contribute_v2_local(Residual_local,v2_local);
#ifdef PZ_LOG
		{
			std::stringstream sout;
			sout << "Substructure " << isub << std::endl;
			Residual_local.Print("Residual local",sout);
            v2_local.Print("v2_local",sout);
			if (logger.isDebugEnabled())
			{
				LOGPZ_DEBUG(logger, sout.str());
			}
		}
#endif
		//		v2_local += v1_local;
		fAssemble->Assemble(isub,v2_local,v2);
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		v2.Print("v2 vector",sout);
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
}